

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawutil.cpp
# Opt level: O2

void qDrawBorderPixmap(QPainter *painter,QRect *targetRect,QMargins *targetMargins,QPixmap *pixmap,
                      QRect *sourceRect,QMargins *sourceMargins,QTileRules *rules,DrawingHints hints
                      )

{
  undefined1 **ppuVar1;
  QVLAStorage<80UL,_8UL,_16LL> *__s;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined1 *puVar7;
  undefined1 *puVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  uint uVar16;
  QVarLengthArray<QPainter::PixmapFragment,_16LL> *pQVar17;
  QVarLengthArray<QPainter::PixmapFragment,_16LL> *pQVar18;
  undefined8 uVar19;
  bool bVar20;
  int i_2;
  int iVar21;
  int iVar22;
  long *plVar23;
  ulong uVar24;
  char cVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  QVarLengthArray<QPainter::PixmapFragment,_16LL> *pQVar32;
  int iVar33;
  int iVar34;
  uint uVar35;
  ulong uVar37;
  long in_FS_OFFSET;
  bool bVar38;
  uint uVar39;
  uint uVar45;
  double dVar40;
  double dVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int iVar46;
  int iVar49;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar50;
  int iVar51;
  double local_ce8;
  double dStack_ce0;
  undefined1 local_c38 [40];
  undefined8 uStack_c10;
  undefined1 local_c08 [12];
  undefined4 uStack_bfc;
  qreal local_bf8;
  qreal qStack_bf0;
  undefined1 local_b98 [24];
  undefined1 *local_b80;
  undefined1 *puStack_b78;
  undefined1 *local_b70;
  undefined1 *puStack_b68;
  undefined1 *local_b60;
  undefined1 *puStack_b58;
  undefined1 *local_b50;
  undefined1 *puStack_b48;
  undefined1 *local_b40;
  undefined1 *puStack_b38;
  undefined1 *local_b30;
  undefined1 *puStack_b28;
  undefined1 *local_b20;
  undefined1 *puStack_b18;
  undefined1 *local_b10;
  undefined1 *puStack_b08;
  undefined1 local_b00 [24];
  undefined1 *local_ae8;
  undefined1 *puStack_ae0;
  undefined1 *local_ad8;
  undefined1 *puStack_ad0;
  undefined1 *local_ac8;
  undefined1 *puStack_ac0;
  undefined1 *local_ab8;
  undefined1 *puStack_ab0;
  undefined1 *local_aa8;
  undefined1 *puStack_aa0;
  undefined1 *local_a98;
  undefined1 *puStack_a90;
  undefined1 *local_a88;
  undefined1 *puStack_a80;
  undefined1 *local_a78;
  undefined1 *puStack_a70;
  QVarLengthArray<QPainter::PixmapFragment,_16LL> local_a68;
  QVarLengthArray<QPainter::PixmapFragment,_16LL> local_550;
  long local_38;
  int iVar36;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __s = &local_550.super_QVLAStorage<80UL,_8UL,_16LL>;
  local_550.super_QVLABase<QPainter::PixmapFragment>.super_QVLABaseBase.a = 0x10;
  local_550.super_QVLABase<QPainter::PixmapFragment>.super_QVLABaseBase.s = 0;
  local_bf8 = 0.0;
  qStack_bf0 = 1.0;
  local_a68.super_QVLABase<QPainter::PixmapFragment>.super_QVLABaseBase.ptr =
       &local_a68.super_QVLAStorage<80UL,_8UL,_16LL>;
  local_a68.super_QVLABase<QPainter::PixmapFragment>.super_QVLABaseBase.a = 0x10;
  local_a68.super_QVLABase<QPainter::PixmapFragment>.super_QVLABaseBase.s = 0;
  uVar2 = sourceRect->x1;
  uVar11 = sourceRect->y1;
  uVar3 = sourceMargins->m_left;
  uVar12 = sourceMargins->m_top;
  iVar46 = uVar3 + uVar2;
  iVar49 = uVar12 + uVar11;
  uVar4 = sourceRect->x2;
  uVar13 = sourceRect->y2;
  uVar5 = sourceMargins->m_right;
  uVar14 = sourceMargins->m_bottom;
  iVar50 = (uVar4 - uVar5) + 1;
  iVar51 = (uVar13 - uVar14) + 1;
  uVar39 = iVar50 - iVar46;
  uVar45 = iVar51 - iVar49;
  iVar34 = (targetMargins->m_left).m_i + (targetRect->x1).m_i;
  uVar24 = 3;
  uVar35 = 3;
  iVar26 = (targetMargins->m_top).m_i + (targetRect->y1).m_i;
  local_b00._16_8_ = &local_ae8;
  local_b00._0_8_ = 0x10;
  local_b98._16_8_ = &local_b80;
  local_b98._0_8_ = 0x10;
  iVar29 = ((targetRect->y2).m_i - (targetMargins->m_bottom).m_i) + 1;
  iVar33 = ((targetRect->x2).m_i - (targetMargins->m_right).m_i) + 1;
  iVar21 = iVar33 - iVar34;
  local_b00._8_8_ = 0;
  local_b98._8_8_ = 0;
  local_550.super_QVLABase<QPainter::PixmapFragment>.super_QVLABaseBase.ptr = __s;
  if ((rules->horizontal != StretchTile) && (uVar24 = 3, (bool)(~(iVar50 == iVar46) & 1))) {
    dVar40 = ceil((double)iVar21 / (double)(int)uVar39);
    iVar30 = (int)dVar40;
    if ((int)dVar40 < 2) {
      iVar30 = 1;
    }
    uVar24 = (ulong)(iVar30 + 2);
  }
  iVar30 = iVar29 - iVar26;
  if ((rules->vertical != StretchTile) && (iVar51 != iVar49)) {
    dVar40 = ceil((double)iVar30 / (double)(int)uVar45);
    iVar36 = 1;
    if (1 < (int)dVar40) {
      iVar36 = (int)dVar40;
    }
    uVar35 = iVar36 + 2;
  }
  local_c08._8_4_ = 0xffffffff;
  local_c08._0_8_ = 0xffffffffffffffff;
  uStack_bfc = 0xffffffff;
  uStack_c10._0_4_ = 0xffffffff;
  local_c38._32_8_ = 0xffffffffffffffff;
  uStack_c10._4_4_ = 0xffffffff;
  local_c38._16_8_ = -NAN;
  local_c38._24_8_ = -NAN;
  local_c38._0_8_ = -NAN;
  local_c38._8_8_ = -NAN;
  memset(__s,0xaa,0x500);
  memset(&local_a68.super_QVLAStorage<80UL,_8UL,_16LL>,0xaa,0x500);
  local_ae8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_ae0 = &DAT_aaaaaaaaaaaaaaaa;
  local_ad8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_ad0 = &DAT_aaaaaaaaaaaaaaaa;
  local_ac8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_ac0 = &DAT_aaaaaaaaaaaaaaaa;
  local_ab8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_ab0 = &DAT_aaaaaaaaaaaaaaaa;
  local_aa8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_aa0 = &DAT_aaaaaaaaaaaaaaaa;
  local_a98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a90 = &DAT_aaaaaaaaaaaaaaaa;
  local_a88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a80 = &DAT_aaaaaaaaaaaaaaaa;
  local_a78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a70 = &DAT_aaaaaaaaaaaaaaaa;
  local_b10 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b08 = &DAT_aaaaaaaaaaaaaaaa;
  local_b20 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b18 = &DAT_aaaaaaaaaaaaaaaa;
  local_b30 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b28 = &DAT_aaaaaaaaaaaaaaaa;
  local_b40 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b38 = &DAT_aaaaaaaaaaaaaaaa;
  local_b50 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b48 = &DAT_aaaaaaaaaaaaaaaa;
  local_b60 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b58 = &DAT_aaaaaaaaaaaaaaaa;
  local_b70 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b68 = &DAT_aaaaaaaaaaaaaaaa;
  local_b80 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b78 = &DAT_aaaaaaaaaaaaaaaa;
  iVar36 = (int)uVar24;
  QVarLengthArray<double,_16LL>::resize
            ((QVarLengthArray<double,_16LL> *)local_b00,(ulong)(iVar36 + 1));
  QVarLengthArray<double,_16LL>::resize
            ((QVarLengthArray<double,_16LL> *)local_b98,(ulong)(uVar35 + 1));
  bVar20 = QPainter::testRenderHint(painter,Antialiasing);
  plVar23 = (long *)QPainter::paintEngine();
  iVar22 = (**(code **)(*plVar23 + 0xa8))(plVar23);
  if (iVar22 != 6) {
    plVar23 = (long *)QPainter::paintEngine();
    iVar22 = (**(code **)(*plVar23 + 0xa8))(plVar23);
    if (bVar20 && iVar22 != 0xd) {
      QPainter::combinedTransform();
      iVar22 = QTransform::type();
      if (iVar22 != 0) {
        QPainter::setRenderHint((RenderHint)painter,true);
      }
    }
  }
  uVar19 = local_b00._16_8_;
  local_ce8 = (double)iVar21;
  iVar22 = (targetRect->x1).m_i;
  *(undefined1 **)local_b00._16_8_ = (undefined1 *)(double)iVar22;
  *(undefined1 **)(local_b00._16_8_ + 8) = (undefined1 *)(double)iVar34;
  uVar31 = (ulong)(iVar36 - 1);
  *(undefined1 **)(local_b00._16_8_ + uVar31 * 8) = (undefined1 *)(double)iVar33;
  *(undefined1 **)(local_b00._16_8_ + uVar24 * 8) =
       (undefined1 *)(double)(((iVar22 + (targetRect->x2).m_i) - (targetRect->x1).m_i) + 1);
  iVar33 = (targetRect->y1).m_i;
  *(undefined1 **)local_b98._16_8_ = (undefined1 *)(double)iVar33;
  *(undefined1 **)(local_b98._16_8_ + 8) = (undefined1 *)(double)iVar26;
  uVar37 = (ulong)(uVar35 - 1);
  *(undefined1 **)(local_b98._16_8_ + uVar37 * 8) = (undefined1 *)(double)iVar29;
  *(undefined1 **)(local_b98._16_8_ + (ulong)uVar35 * 8) =
       (undefined1 *)(double)(((iVar33 + (targetRect->y2).m_i) - (targetRect->y1).m_i) + 1);
  if (rules->horizontal == RoundTile) {
    local_ce8 = local_ce8 / (double)(iVar36 + -2);
  }
  else if (rules->horizontal == RepeatTile) {
    local_ce8 = (double)(int)uVar39;
  }
  dVar40 = (double)iVar30;
  for (uVar28 = 2; uVar28 < uVar31; uVar28 = uVar28 + 1) {
    *(undefined1 **)(uVar19 + uVar28 * 8) =
         (undefined1 *)((double)*(undefined1 **)(uVar19 + (uVar28 - 1) * 8) + local_ce8);
  }
  if (rules->vertical == RepeatTile) {
    dVar40 = (double)(int)uVar45;
  }
  else if (rules->vertical == RoundTile) {
    dVar40 = dVar40 / (double)(int)(uVar35 - 2);
  }
  for (uVar28 = 2; uVar28 < uVar37; uVar28 = uVar28 + 1) {
    *(undefined1 **)(local_b98._16_8_ + uVar28 * 8) =
         (undefined1 *)((double)*(undefined1 **)(local_b98._16_8_ + (uVar28 - 1) * 8) + dVar40);
  }
  if (0 < (targetMargins->m_top).m_i) {
    if (0 < (targetMargins->m_left).m_i) {
      iVar26 = (sourceMargins->m_top).m_i;
      if ((0 < iVar26) && (iVar29 = (sourceMargins->m_left).m_i, 0 < iVar29)) {
        local_c38._0_8_ =
             ((double)*(undefined1 **)(uVar19 + 8) + (double)*(undefined1 **)uVar19) * 0.5;
        local_c38._8_8_ =
             ((double)*(undefined1 **)(local_b98._16_8_ + 8) +
             (double)*(undefined1 **)local_b98._16_8_) * 0.5;
        uVar6 = sourceRect->x1;
        uVar15 = sourceRect->y1;
        local_c38._16_8_ = (undefined8)(int)uVar6;
        local_c38._24_8_ = (undefined8)(int)uVar15;
        local_c38._32_8_ = (undefined8)iVar29;
        uStack_c10 = (double)iVar26;
        stack0xfffffffffffff400 =
             ((double)*(undefined1 **)(local_b98._16_8_ + 8) -
             (double)*(undefined1 **)local_b98._16_8_) / uStack_c10;
        local_c08._0_8_ =
             ((double)*(undefined1 **)(uVar19 + 8) - (double)*(undefined1 **)uVar19) /
             (double)local_c38._32_8_;
        pQVar32 = &local_550;
        if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                   super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 1) == 0) {
          pQVar32 = &local_a68;
        }
        QVarLengthArray<QPainter::PixmapFragment,_16LL>::append(pQVar32,(PixmapFragment *)local_c38)
        ;
      }
      if ((targetMargins->m_top).m_i < 1) goto LAB_0032fdde;
    }
    if (((0 < (targetMargins->m_right).m_i) && (iVar26 = (sourceMargins->m_top).m_i, 0 < iVar26)) &&
       (iVar29 = (sourceMargins->m_right).m_i, 0 < iVar29)) {
      local_c38._0_8_ =
           ((double)*(undefined1 **)(local_b00._16_8_ + uVar24 * 8) +
           (double)*(undefined1 **)(local_b00._16_8_ + uVar31 * 8)) * 0.5;
      local_c38._8_8_ =
           ((double)*(undefined1 **)(local_b98._16_8_ + 8) +
           (double)*(undefined1 **)local_b98._16_8_) * 0.5;
      local_c38._16_8_ = (undefined8)iVar50;
      local_c38._24_8_ = (undefined8)(sourceRect->y1).m_i;
      local_c38._32_8_ = (undefined8)iVar29;
      uStack_c10 = (double)iVar26;
      stack0xfffffffffffff400 =
           ((double)*(undefined1 **)(local_b98._16_8_ + 8) -
           (double)*(undefined1 **)local_b98._16_8_) / uStack_c10;
      local_c08._0_8_ =
           ((double)*(undefined1 **)(local_b00._16_8_ + uVar24 * 8) -
           (double)*(undefined1 **)(local_b00._16_8_ + uVar31 * 8)) / (double)local_c38._32_8_;
      pQVar32 = &local_550;
      if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                 super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 4) == 0) {
        pQVar32 = &local_a68;
      }
      QVarLengthArray<QPainter::PixmapFragment,_16LL>::append(pQVar32,(PixmapFragment *)local_c38);
    }
  }
LAB_0032fdde:
  if (0 < (targetMargins->m_bottom).m_i) {
    if (0 < (targetMargins->m_left).m_i) {
      iVar26 = (sourceMargins->m_bottom).m_i;
      if ((0 < iVar26) && (iVar29 = (sourceMargins->m_left).m_i, 0 < iVar29)) {
        local_c38._0_8_ =
             ((double)*(undefined1 **)(local_b00._16_8_ + 8) +
             (double)*(undefined1 **)local_b00._16_8_) * 0.5;
        local_c38._8_8_ =
             ((double)*(undefined1 **)(local_b98._16_8_ + (ulong)uVar35 * 8) +
             (double)*(undefined1 **)(local_b98._16_8_ + uVar37 * 8)) * 0.5;
        local_c38._16_8_ = (undefined8)(sourceRect->x1).m_i;
        local_c38._24_8_ = (undefined8)iVar51;
        local_c38._32_8_ = (undefined8)iVar29;
        uStack_c10 = (double)iVar26;
        stack0xfffffffffffff400 =
             ((double)*(undefined1 **)(local_b98._16_8_ + (ulong)uVar35 * 8) -
             (double)*(undefined1 **)(local_b98._16_8_ + uVar37 * 8)) / uStack_c10;
        local_c08._0_8_ =
             ((double)*(undefined1 **)(local_b00._16_8_ + 8) -
             (double)*(undefined1 **)local_b00._16_8_) / (double)local_c38._32_8_;
        pQVar32 = &local_550;
        if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                   super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 0x40) == 0) {
          pQVar32 = &local_a68;
        }
        QVarLengthArray<QPainter::PixmapFragment,_16LL>::append(pQVar32,(PixmapFragment *)local_c38)
        ;
      }
      if ((targetMargins->m_bottom).m_i < 1) goto LAB_0032ffc5;
    }
    if (((0 < (targetMargins->m_right).m_i) && (iVar26 = (sourceMargins->m_bottom).m_i, 0 < iVar26))
       && (iVar29 = (sourceMargins->m_right).m_i, 0 < iVar29)) {
      local_c38._0_8_ =
           ((double)*(undefined1 **)(local_b00._16_8_ + uVar24 * 8) +
           (double)*(undefined1 **)(local_b00._16_8_ + uVar31 * 8)) * 0.5;
      local_c38._8_8_ =
           ((double)*(undefined1 **)(local_b98._16_8_ + (ulong)uVar35 * 8) +
           (double)*(undefined1 **)(local_b98._16_8_ + uVar37 * 8)) * 0.5;
      local_c38._16_8_ = (undefined8)iVar50;
      local_c38._24_8_ = (undefined8)iVar51;
      local_c38._32_8_ = (undefined8)iVar29;
      uStack_c10 = (double)iVar26;
      stack0xfffffffffffff400 =
           ((double)*(undefined1 **)(local_b98._16_8_ + (ulong)uVar35 * 8) -
           (double)*(undefined1 **)(local_b98._16_8_ + uVar37 * 8)) / uStack_c10;
      local_c08._0_8_ =
           ((double)*(undefined1 **)(local_b00._16_8_ + uVar24 * 8) -
           (double)*(undefined1 **)(local_b00._16_8_ + uVar31 * 8)) / (double)local_c38._32_8_;
      pQVar32 = &local_550;
      if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                 super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i >> 8 & 1) == 0) {
        pQVar32 = &local_a68;
      }
      QVarLengthArray<QPainter::PixmapFragment,_16LL>::append(pQVar32,(PixmapFragment *)local_c38);
    }
  }
LAB_0032ffc5:
  if ((0 < iVar21) && (0 < (int)uVar39)) {
    dVar41 = (double)(int)uVar39;
    if ((0 < (targetMargins->m_top).m_i) && (iVar26 = (sourceMargins->m_top).m_i, 0 < iVar26)) {
      pQVar32 = &local_550;
      if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                 super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 2) == 0) {
        pQVar32 = &local_a68;
      }
      local_c38._16_8_ = (undefined8)iVar46;
      local_c38._24_8_ = (undefined8)(sourceRect->y1).m_i;
      uStack_c10 = (double)iVar26;
      local_c38._32_8_ = dVar41;
      local_c38._8_8_ =
           ((double)*(undefined1 **)(local_b98._16_8_ + 8) +
           (double)*(undefined1 **)local_b98._16_8_) * 0.5;
      stack0xfffffffffffff400 =
           ((double)*(undefined1 **)(local_b98._16_8_ + 8) -
           (double)*(undefined1 **)local_b98._16_8_) / uStack_c10;
      local_c08._0_8_ = local_ce8 / dVar41;
      for (uVar28 = 1; uVar28 < uVar31; uVar28 = uVar28 + 1) {
        local_c38._0_8_ =
             ((double)*(undefined1 **)(local_b00._16_8_ + (uVar28 + 1) * 8) +
             (double)*(undefined1 **)(local_b00._16_8_ + uVar28 * 8)) * 0.5;
        QVarLengthArray<QPainter::PixmapFragment,_16LL>::append(pQVar32,(PixmapFragment *)local_c38)
        ;
      }
      if (rules->horizontal == RepeatTile) {
        bVar38 = ((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                        super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 2) == 0;
        pQVar32 = &local_550;
        if (bVar38) {
          pQVar32 = &local_a68;
        }
        pQVar17 = &local_550;
        if (bVar38) {
          pQVar17 = &local_a68;
        }
        *(double *)
         ((long)(pQVar17->super_QVLABase<QPainter::PixmapFragment>).super_QVLABaseBase.ptr +
         (pQVar32->super_QVLABase<QPainter::PixmapFragment>).super_QVLABaseBase.s * 0x50 + -0x30) =
             ((double)*(undefined1 **)(local_b00._16_8_ + uVar31 * 8) -
             (double)*(undefined1 **)(local_b00._16_8_ + (uVar24 - 2) * 8)) /
             (double)local_c08._0_8_;
      }
    }
    if ((0 < (targetMargins->m_bottom).m_i) && (iVar26 = (sourceMargins->m_bottom).m_i, 0 < iVar26))
    {
      cVar25 = (char)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                     super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i;
      pQVar32 = &local_550;
      if (-1 < cVar25) {
        pQVar32 = &local_a68;
      }
      local_c38._16_8_ = (undefined8)iVar46;
      local_c38._24_8_ = (undefined8)iVar51;
      uStack_c10 = (double)iVar26;
      local_c38._32_8_ = dVar41;
      local_c38._8_8_ =
           ((double)*(undefined1 **)(local_b98._16_8_ + (ulong)uVar35 * 8) +
           (double)*(undefined1 **)(local_b98._16_8_ + uVar37 * 8)) * 0.5;
      stack0xfffffffffffff400 =
           ((double)*(undefined1 **)(local_b98._16_8_ + (ulong)uVar35 * 8) -
           (double)*(undefined1 **)(local_b98._16_8_ + uVar37 * 8)) / uStack_c10;
      local_c08._0_8_ = local_ce8 / dVar41;
      for (uVar28 = 1; uVar28 < uVar31; uVar28 = uVar28 + 1) {
        local_c38._0_8_ =
             ((double)*(undefined1 **)(local_b00._16_8_ + (uVar28 + 1) * 8) +
             (double)*(undefined1 **)(local_b00._16_8_ + uVar28 * 8)) * 0.5;
        QVarLengthArray<QPainter::PixmapFragment,_16LL>::append(pQVar32,(PixmapFragment *)local_c38)
        ;
      }
      if (rules->horizontal == RepeatTile) {
        pQVar32 = &local_550;
        if (-1 < cVar25) {
          pQVar32 = &local_a68;
        }
        pQVar17 = &local_550;
        if (-1 < cVar25) {
          pQVar17 = &local_a68;
        }
        *(double *)
         ((long)(pQVar17->super_QVLABase<QPainter::PixmapFragment>).super_QVLABaseBase.ptr +
         (pQVar32->super_QVLABase<QPainter::PixmapFragment>).super_QVLABaseBase.s * 0x50 + -0x30) =
             ((double)*(undefined1 **)(local_b00._16_8_ + uVar31 * 8) -
             (double)*(undefined1 **)(local_b00._16_8_ + (uVar24 - 2) * 8)) /
             (double)local_c08._0_8_;
      }
    }
  }
  if ((0 < iVar30) && (0 < (int)uVar45)) {
    if ((0 < (targetMargins->m_left).m_i) && (uVar16 = (sourceMargins->m_left).m_i, 0 < (int)uVar16)
       ) {
      pQVar32 = &local_550;
      if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                 super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 8) == 0) {
        pQVar32 = &local_a68;
      }
      local_c38._16_8_ = (undefined8)(sourceRect->x1).m_i;
      local_c38._24_8_ = (undefined8)iVar49;
      auVar47._4_4_ = 0;
      auVar47._0_4_ = uVar16;
      auVar47._8_4_ = uVar45;
      auVar47._12_4_ = 0;
      local_c38._32_8_ = SUB168(auVar47 | _DAT_005ee990,0) - (double)DAT_005ee990;
      uStack_c10 = SUB168(auVar47 | _DAT_005ee990,8) - DAT_005ee990._8_8_;
      local_c38._0_8_ =
           ((double)*(undefined1 **)local_b00._16_8_ +
           (double)*(undefined1 **)(local_b00._16_8_ + 8)) * 0.5;
      auVar44._0_8_ =
           (double)*(undefined1 **)(local_b00._16_8_ + 8) - (double)*(undefined1 **)local_b00._16_8_
      ;
      auVar44._8_8_ = dVar40;
      _local_c08 = divpd(auVar44,register0x00001240);
      for (uVar28 = 1; uVar28 < uVar37; uVar28 = uVar28 + 1) {
        local_c38._8_8_ =
             ((double)*(undefined1 **)(local_b98._16_8_ + (uVar28 + 1) * 8) +
             (double)*(undefined1 **)(local_b98._16_8_ + uVar28 * 8)) * 0.5;
        QVarLengthArray<QPainter::PixmapFragment,_16LL>::append(pQVar32,(PixmapFragment *)local_c38)
        ;
      }
      if (rules->vertical == RepeatTile) {
        bVar38 = ((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                        super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 8) == 0;
        pQVar32 = &local_550;
        if (bVar38) {
          pQVar32 = &local_a68;
        }
        pQVar17 = &local_550;
        if (bVar38) {
          pQVar17 = &local_a68;
        }
        *(double *)
         ((long)(pQVar17->super_QVLABase<QPainter::PixmapFragment>).super_QVLABaseBase.ptr +
         (pQVar32->super_QVLABase<QPainter::PixmapFragment>).super_QVLABaseBase.s * 0x50 + -0x28) =
             ((double)*(undefined1 **)(local_b98._16_8_ + uVar37 * 8) -
             (double)*(undefined1 **)(local_b98._16_8_ + ((ulong)uVar35 - 2) * 8)) /
             stack0xfffffffffffff400;
      }
    }
    if ((0 < (targetMargins->m_right).m_i) &&
       (uVar16 = (sourceMargins->m_right).m_i, 0 < (int)uVar16)) {
      pQVar32 = &local_550;
      if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                 super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 0x20) == 0) {
        pQVar32 = &local_a68;
      }
      local_c38._16_8_ = (undefined8)iVar50;
      local_c38._24_8_ = (undefined8)iVar49;
      auVar48._4_4_ = 0;
      auVar48._0_4_ = uVar16;
      auVar48._8_4_ = uVar45;
      auVar48._12_4_ = 0;
      local_c38._32_8_ = SUB168(auVar48 | _DAT_005ee990,0) - (double)DAT_005ee990;
      uStack_c10 = SUB168(auVar48 | _DAT_005ee990,8) - DAT_005ee990._8_8_;
      local_c38._0_8_ =
           ((double)*(undefined1 **)(local_b00._16_8_ + uVar24 * 8) +
           (double)*(undefined1 **)(local_b00._16_8_ + uVar31 * 8)) * 0.5;
      auVar42._0_8_ =
           (double)*(undefined1 **)(local_b00._16_8_ + uVar24 * 8) -
           (double)*(undefined1 **)(local_b00._16_8_ + uVar31 * 8);
      auVar42._8_8_ = dVar40;
      _local_c08 = divpd(auVar42,register0x00001240);
      for (uVar28 = 1; uVar28 < uVar37; uVar28 = uVar28 + 1) {
        local_c38._8_8_ =
             ((double)*(undefined1 **)(local_b98._16_8_ + (uVar28 + 1) * 8) +
             (double)*(undefined1 **)(local_b98._16_8_ + uVar28 * 8)) * 0.5;
        QVarLengthArray<QPainter::PixmapFragment,_16LL>::append(pQVar32,(PixmapFragment *)local_c38)
        ;
      }
      if (rules->vertical == RepeatTile) {
        bVar38 = ((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                        super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 0x20) == 0;
        pQVar32 = &local_550;
        if (bVar38) {
          pQVar32 = &local_a68;
        }
        pQVar17 = &local_550;
        if (bVar38) {
          pQVar17 = &local_a68;
        }
        *(double *)
         ((long)(pQVar17->super_QVLABase<QPainter::PixmapFragment>).super_QVLABaseBase.ptr +
         (pQVar32->super_QVLABase<QPainter::PixmapFragment>).super_QVLABaseBase.s * 0x50 + -0x28) =
             ((double)*(undefined1 **)(local_b98._16_8_ + uVar37 * 8) -
             (double)*(undefined1 **)(local_b98._16_8_ + ((ulong)uVar35 - 2) * 8)) /
             stack0xfffffffffffff400;
      }
    }
  }
  if ((((0 < iVar30) && (0 < iVar21)) && (0 < (int)uVar39)) && (0 < (int)uVar45)) {
    pQVar32 = &local_550;
    if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
               super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 0x10) == 0) {
      pQVar32 = &local_a68;
    }
    local_c38._16_8_ = (undefined8)iVar46;
    local_c38._24_8_ = (undefined8)iVar49;
    local_c38._32_8_ = (double)((ulong)uVar39 | 0x4330000000000000) - 4503599627370496.0;
    uStack_c10 = (double)((ulong)uVar45 | 0x4330000000000000) - 4503599627370496.0;
    auVar43._8_8_ = dVar40;
    auVar43._0_8_ = local_ce8;
    auVar44 = divpd(auVar43,register0x00001240);
    puVar7 = *(undefined1 **)(local_b00._16_8_ + uVar31 * 8);
    puVar8 = *(undefined1 **)(local_b00._16_8_ + (uVar24 - 2) * 8);
    puVar9 = *(undefined1 **)(local_b98._16_8_ + uVar37 * 8);
    puVar10 = *(undefined1 **)(local_b98._16_8_ + ((ulong)uVar35 - 2) * 8);
    uVar24 = 1;
    _local_c08 = auVar44;
    while (uVar24 < uVar37) {
      lVar27 = uVar24 + 1;
      ppuVar1 = (undefined1 **)(local_b98._16_8_ + uVar24 * 8);
      uVar24 = uVar24 + 1;
      local_c38._8_8_ =
           ((double)*(undefined1 **)(local_b98._16_8_ + lVar27 * 8) + (double)*ppuVar1) * 0.5;
      for (uVar28 = 1; uVar28 < uVar31; uVar28 = uVar28 + 1) {
        local_c38._0_8_ =
             ((double)*(undefined1 **)(local_b00._16_8_ + (uVar28 + 1) * 8) +
             (double)*(undefined1 **)(local_b00._16_8_ + uVar28 * 8)) * 0.5;
        QVarLengthArray<QPainter::PixmapFragment,_16LL>::append(pQVar32,(PixmapFragment *)local_c38)
        ;
      }
      if (rules->horizontal == RepeatTile) {
        bVar38 = ((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                        super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 0x10) == 0;
        pQVar17 = &local_550;
        if (bVar38) {
          pQVar17 = &local_a68;
        }
        pQVar18 = &local_550;
        if (bVar38) {
          pQVar18 = &local_a68;
        }
        *(double *)
         ((long)(pQVar18->super_QVLABase<QPainter::PixmapFragment>).super_QVLABaseBase.ptr +
         (pQVar17->super_QVLABase<QPainter::PixmapFragment>).super_QVLABaseBase.s * 0x50 + -0x30) =
             ((double)puVar7 - (double)puVar8) / auVar44._0_8_;
      }
    }
    if (rules->vertical == RepeatTile) {
      dStack_ce0 = auVar44._8_8_;
      lVar27 = -1;
      for (uVar24 = 1; uVar24 < uVar31; uVar24 = uVar24 + 1) {
        bVar38 = ((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                        super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 0x10) == 0;
        pQVar32 = &local_550;
        if (bVar38) {
          pQVar32 = &local_a68;
        }
        pQVar17 = &local_550;
        if (bVar38) {
          pQVar17 = &local_a68;
        }
        *(double *)
         ((long)(pQVar17->super_QVLABase<QPainter::PixmapFragment>).super_QVLABaseBase.ptr +
         ((pQVar32->super_QVLABase<QPainter::PixmapFragment>).super_QVLABaseBase.s + lVar27) * 0x50
         + 0x28) = ((double)puVar9 - (double)puVar10) / dStack_ce0;
        lVar27 = lVar27 + -1;
      }
    }
  }
  if (local_550.super_QVLABase<QPainter::PixmapFragment>.super_QVLABaseBase.s != 0) {
    QPainter::drawPixmapFragments
              (painter,local_550.super_QVLABase<QPainter::PixmapFragment>.super_QVLABaseBase.ptr,
               local_550.super_QVLABase<QPainter::PixmapFragment>.super_QVLABaseBase.s,pixmap,1);
  }
  if (local_a68.super_QVLABase<QPainter::PixmapFragment>.super_QVLABaseBase.s != 0) {
    QPainter::drawPixmapFragments
              (painter,local_a68.super_QVLABase<QPainter::PixmapFragment>.super_QVLABaseBase.ptr,
               local_a68.super_QVLABase<QPainter::PixmapFragment>.super_QVLABaseBase.s,pixmap,0);
  }
  if (bVar20) {
    QPainter::setRenderHint((RenderHint)painter,true);
  }
  QVarLengthArray<double,_16LL>::~QVarLengthArray((QVarLengthArray<double,_16LL> *)local_b98);
  QVarLengthArray<double,_16LL>::~QVarLengthArray((QVarLengthArray<double,_16LL> *)local_b00);
  QVarLengthArray<QPainter::PixmapFragment,_16LL>::~QVarLengthArray(&local_a68);
  QVarLengthArray<QPainter::PixmapFragment,_16LL>::~QVarLengthArray(&local_550);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void qDrawBorderPixmap(QPainter *painter, const QRect &targetRect, const QMargins &targetMargins,
                       const QPixmap &pixmap, const QRect &sourceRect,const QMargins &sourceMargins,
                       const QTileRules &rules
#ifndef Q_QDOC
                       , QDrawBorderPixmap::DrawingHints hints
#endif
                       )
{
    QPainter::PixmapFragment d;
    d.opacity = 1.0;
    d.rotation = 0.0;

    QPixmapFragmentsArray opaqueData;
    QPixmapFragmentsArray translucentData;

    // source center
    const int sourceCenterTop = sourceRect.top() + sourceMargins.top();
    const int sourceCenterLeft = sourceRect.left() + sourceMargins.left();
    const int sourceCenterBottom = sourceRect.bottom() - sourceMargins.bottom() + 1;
    const int sourceCenterRight = sourceRect.right() - sourceMargins.right() + 1;
    const int sourceCenterWidth = sourceCenterRight - sourceCenterLeft;
    const int sourceCenterHeight = sourceCenterBottom - sourceCenterTop;
    // target center
    const int targetCenterTop = targetRect.top() + targetMargins.top();
    const int targetCenterLeft = targetRect.left() + targetMargins.left();
    const int targetCenterBottom = targetRect.bottom() - targetMargins.bottom() + 1;
    const int targetCenterRight = targetRect.right() - targetMargins.right() + 1;
    const int targetCenterWidth = targetCenterRight - targetCenterLeft;
    const int targetCenterHeight = targetCenterBottom - targetCenterTop;

    QVarLengthArray<qreal, 16> xTarget; // x-coordinates of target rectangles
    QVarLengthArray<qreal, 16> yTarget; // y-coordinates of target rectangles

    int columns = 3;
    int rows = 3;
    if (rules.horizontal != Qt::StretchTile && sourceCenterWidth != 0)
        columns = qMax(3, 2 + qCeil(targetCenterWidth / qreal(sourceCenterWidth)));
    if (rules.vertical != Qt::StretchTile && sourceCenterHeight != 0)
        rows = qMax(3, 2 + qCeil(targetCenterHeight / qreal(sourceCenterHeight)));

    xTarget.resize(columns + 1);
    yTarget.resize(rows + 1);

    bool oldAA = painter->testRenderHint(QPainter::Antialiasing);
    if (painter->paintEngine()->type() != QPaintEngine::OpenGL
        && painter->paintEngine()->type() != QPaintEngine::OpenGL2
        && oldAA && painter->combinedTransform().type() != QTransform::TxNone) {
        painter->setRenderHint(QPainter::Antialiasing, false);
    }

    xTarget[0] = targetRect.left();
    xTarget[1] = targetCenterLeft;
    xTarget[columns - 1] = targetCenterRight;
    xTarget[columns] = targetRect.left() + targetRect.width();

    yTarget[0] = targetRect.top();
    yTarget[1] = targetCenterTop;
    yTarget[rows - 1] = targetCenterBottom;
    yTarget[rows] = targetRect.top() + targetRect.height();

    qreal dx = targetCenterWidth;
    qreal dy = targetCenterHeight;

    switch (rules.horizontal) {
    case Qt::StretchTile:
        dx = targetCenterWidth;
        break;
    case Qt::RepeatTile:
        dx = sourceCenterWidth;
        break;
    case Qt::RoundTile:
        dx = targetCenterWidth / qreal(columns - 2);
        break;
    }

    for (int i = 2; i < columns - 1; ++i)
        xTarget[i] = xTarget[i - 1] + dx;

    switch (rules.vertical) {
    case Qt::StretchTile:
        dy = targetCenterHeight;
        break;
    case Qt::RepeatTile:
        dy = sourceCenterHeight;
        break;
    case Qt::RoundTile:
        dy = targetCenterHeight / qreal(rows - 2);
        break;
    }

    for (int i = 2; i < rows - 1; ++i)
        yTarget[i] = yTarget[i - 1] + dy;

    // corners
    if (targetMargins.top() > 0 && targetMargins.left() > 0 && sourceMargins.top() > 0 && sourceMargins.left() > 0) { // top left
        d.x = (0.5 * (xTarget[1] + xTarget[0]));
        d.y = (0.5 * (yTarget[1] + yTarget[0]));
        d.sourceLeft = sourceRect.left();
        d.sourceTop = sourceRect.top();
        d.width = sourceMargins.left();
        d.height = sourceMargins.top();
        d.scaleX = qreal(xTarget[1] - xTarget[0]) / d.width;
        d.scaleY = qreal(yTarget[1] - yTarget[0]) / d.height;
        if (hints & QDrawBorderPixmap::OpaqueTopLeft)
            opaqueData.append(d);
        else
            translucentData.append(d);
    }
    if (targetMargins.top() > 0 && targetMargins.right() > 0 && sourceMargins.top() > 0 && sourceMargins.right() > 0) { // top right
        d.x = (0.5 * (xTarget[columns] + xTarget[columns - 1]));
        d.y = (0.5 * (yTarget[1] + yTarget[0]));
        d.sourceLeft = sourceCenterRight;
        d.sourceTop = sourceRect.top();
        d.width = sourceMargins.right();
        d.height = sourceMargins.top();
        d.scaleX = qreal(xTarget[columns] - xTarget[columns - 1]) / d.width;
        d.scaleY = qreal(yTarget[1] - yTarget[0]) / d.height;
        if (hints & QDrawBorderPixmap::OpaqueTopRight)
            opaqueData.append(d);
        else
            translucentData.append(d);
    }
    if (targetMargins.bottom() > 0 && targetMargins.left() > 0 && sourceMargins.bottom() > 0 && sourceMargins.left() > 0) { // bottom left
        d.x = (0.5 * (xTarget[1] + xTarget[0]));
        d.y =(0.5 * (yTarget[rows] + yTarget[rows - 1]));
        d.sourceLeft = sourceRect.left();
        d.sourceTop = sourceCenterBottom;
        d.width = sourceMargins.left();
        d.height = sourceMargins.bottom();
        d.scaleX = qreal(xTarget[1] - xTarget[0]) / d.width;
        d.scaleY = qreal(yTarget[rows] - yTarget[rows - 1]) / d.height;
        if (hints & QDrawBorderPixmap::OpaqueBottomLeft)
            opaqueData.append(d);
        else
            translucentData.append(d);
    }
    if (targetMargins.bottom() > 0 && targetMargins.right() > 0 && sourceMargins.bottom() > 0 && sourceMargins.right() > 0) { // bottom right
        d.x = (0.5 * (xTarget[columns] + xTarget[columns - 1]));
        d.y = (0.5 * (yTarget[rows] + yTarget[rows - 1]));
        d.sourceLeft = sourceCenterRight;
        d.sourceTop = sourceCenterBottom;
        d.width = sourceMargins.right();
        d.height = sourceMargins.bottom();
        d.scaleX = qreal(xTarget[columns] - xTarget[columns - 1]) / d.width;
        d.scaleY = qreal(yTarget[rows] - yTarget[rows - 1]) / d.height;
        if (hints & QDrawBorderPixmap::OpaqueBottomRight)
            opaqueData.append(d);
        else
            translucentData.append(d);
    }

    // horizontal edges
    if (targetCenterWidth > 0 && sourceCenterWidth > 0) {
        if (targetMargins.top() > 0 && sourceMargins.top() > 0) { // top
            QPixmapFragmentsArray &data = hints & QDrawBorderPixmap::OpaqueTop ? opaqueData : translucentData;
            d.sourceLeft = sourceCenterLeft;
            d.sourceTop = sourceRect.top();
            d.width = sourceCenterWidth;
            d.height = sourceMargins.top();
            d.y = (0.5 * (yTarget[1] + yTarget[0]));
            d.scaleX = dx / d.width;
            d.scaleY = qreal(yTarget[1] - yTarget[0]) / d.height;
            for (int i = 1; i < columns - 1; ++i) {
                d.x = (0.5 * (xTarget[i + 1] + xTarget[i]));
                data.append(d);
            }
            if (rules.horizontal == Qt::RepeatTile)
                data[data.size() - 1].width = ((xTarget[columns - 1] - xTarget[columns - 2]) / d.scaleX);
        }
        if (targetMargins.bottom() > 0 && sourceMargins.bottom() > 0) { // bottom
            QPixmapFragmentsArray &data = hints & QDrawBorderPixmap::OpaqueBottom ? opaqueData : translucentData;
            d.sourceLeft = sourceCenterLeft;
            d.sourceTop = sourceCenterBottom;
            d.width = sourceCenterWidth;
            d.height = sourceMargins.bottom();
            d.y = (0.5 * (yTarget[rows] + yTarget[rows - 1]));
            d.scaleX = dx / d.width;
            d.scaleY = qreal(yTarget[rows] - yTarget[rows - 1]) / d.height;
            for (int i = 1; i < columns - 1; ++i) {
                d.x = (0.5 * (xTarget[i + 1] + xTarget[i]));
                data.append(d);
            }
            if (rules.horizontal == Qt::RepeatTile)
                data[data.size() - 1].width = ((xTarget[columns - 1] - xTarget[columns - 2]) / d.scaleX);
        }
    }

    // vertical edges
    if (targetCenterHeight > 0 && sourceCenterHeight > 0) {
        if (targetMargins.left() > 0 && sourceMargins.left() > 0) { // left
            QPixmapFragmentsArray &data = hints & QDrawBorderPixmap::OpaqueLeft ? opaqueData : translucentData;
            d.sourceLeft = sourceRect.left();
            d.sourceTop = sourceCenterTop;
            d.width = sourceMargins.left();
            d.height = sourceCenterHeight;
            d.x = (0.5 * (xTarget[1] + xTarget[0]));
            d.scaleX = qreal(xTarget[1] - xTarget[0]) / d.width;
            d.scaleY = dy / d.height;
            for (int i = 1; i < rows - 1; ++i) {
                d.y = (0.5 * (yTarget[i + 1] + yTarget[i]));
                data.append(d);
            }
            if (rules.vertical == Qt::RepeatTile)
                data[data.size() - 1].height = ((yTarget[rows - 1] - yTarget[rows - 2]) / d.scaleY);
        }
        if (targetMargins.right() > 0 && sourceMargins.right() > 0) { // right
            QPixmapFragmentsArray &data = hints & QDrawBorderPixmap::OpaqueRight ? opaqueData : translucentData;
            d.sourceLeft = sourceCenterRight;
            d.sourceTop = sourceCenterTop;
            d.width = sourceMargins.right();
            d.height = sourceCenterHeight;
            d.x = (0.5 * (xTarget[columns] + xTarget[columns - 1]));
            d.scaleX = qreal(xTarget[columns] - xTarget[columns - 1]) / d.width;
            d.scaleY = dy / d.height;
            for (int i = 1; i < rows - 1; ++i) {
                d.y = (0.5 * (yTarget[i + 1] + yTarget[i]));
                data.append(d);
            }
            if (rules.vertical == Qt::RepeatTile)
                data[data.size() - 1].height = ((yTarget[rows - 1] - yTarget[rows - 2]) / d.scaleY);
        }
    }

    // center
    if (targetCenterWidth > 0 && targetCenterHeight > 0 && sourceCenterWidth > 0 && sourceCenterHeight > 0) {
        QPixmapFragmentsArray &data = hints & QDrawBorderPixmap::OpaqueCenter ? opaqueData : translucentData;
        d.sourceLeft = sourceCenterLeft;
        d.sourceTop = sourceCenterTop;
        d.width = sourceCenterWidth;
        d.height = sourceCenterHeight;
        d.scaleX = dx / d.width;
        d.scaleY = dy / d.height;

        qreal repeatWidth = (xTarget[columns - 1] - xTarget[columns - 2]) / d.scaleX;
        qreal repeatHeight = (yTarget[rows - 1] - yTarget[rows - 2]) / d.scaleY;

        for (int j = 1; j < rows - 1; ++j) {
            d.y = (0.5 * (yTarget[j + 1] + yTarget[j]));
            for (int i = 1; i < columns - 1; ++i) {
                d.x = (0.5 * (xTarget[i + 1] + xTarget[i]));
                data.append(d);
            }
            if (rules.horizontal == Qt::RepeatTile)
                data[data.size() - 1].width = repeatWidth;
        }
        if (rules.vertical == Qt::RepeatTile) {
            for (int i = 1; i < columns - 1; ++i)
                data[data.size() - i].height = repeatHeight;
        }
    }

    if (opaqueData.size())
        painter->drawPixmapFragments(opaqueData.data(), opaqueData.size(), pixmap, QPainter::OpaqueHint);
    if (translucentData.size())
        painter->drawPixmapFragments(translucentData.data(), translucentData.size(), pixmap);

    if (oldAA)
        painter->setRenderHint(QPainter::Antialiasing, true);
}